

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O3

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_TypeAttributeNotFIXorFIXT::
~TestreadFromDocument_TypeAttributeNotFIXorFIXT
          (TestreadFromDocument_TypeAttributeNotFIXorFIXT *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(readFromDocument_TypeAttributeNotFIXorFIXT) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml = "<fix type='WrongType' major='4' minor='2' servicepack='0'></fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}